

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

SizeType __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewState
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType out,
          SizeType out1,uint codepoint)

{
  SizeType SVar1;
  State *pSVar2;
  
  pSVar2 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,1);
  pSVar2->out = out;
  pSVar2->out1 = out1;
  pSVar2->codepoint = codepoint;
  pSVar2->rangeStart = 0xffffffff;
  SVar1 = this->stateCount_;
  this->stateCount_ = SVar1 + 1;
  return SVar1;
}

Assistant:

SizeType NewState(SizeType out, SizeType out1, unsigned codepoint) {
        State* s = states_.template Push<State>();
        s->out = out;
        s->out1 = out1;
        s->codepoint = codepoint;
        s->rangeStart = kRegexInvalidRange;
        return stateCount_++;
    }